

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeid.h
# Opt level: O2

void pybind11::detail::clean_type_id(string *name)

{
  string local_58;
  int local_34;
  undefined1 auStack_30 [4];
  int status;
  unique_ptr<char,_void_(*)(void_*)> res;
  
  local_34 = 0;
  res._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)
       __cxa_demangle((name->_M_dataplus)._M_p,0,0,&local_34);
  _auStack_30 = free;
  if (local_34 == 0) {
    std::__cxx11::string::assign((char *)name);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"pybind11::",
             (allocator<char> *)
             ((long)&res._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
                     super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.
                     super__Head_base<0UL,_char_*,_false>._M_head_impl + 7));
  erase_all(name,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::unique_ptr<char,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<char,_void_(*)(void_*)> *)auStack_30);
  return;
}

Assistant:

PYBIND11_NOINLINE void clean_type_id(std::string &name) {
#if defined(__GNUG__)
    int status = 0;
    std::unique_ptr<char, void (*)(void *)> res {
        abi::__cxa_demangle(name.c_str(), nullptr, nullptr, &status), std::free };
    if (status == 0)
        name = res.get();
#else
    detail::erase_all(name, "class ");
    detail::erase_all(name, "struct ");
    detail::erase_all(name, "enum ");
#endif
    detail::erase_all(name, "pybind11::");
}